

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall stringToUnits_complex_Test::TestBody(stringToUnits_complex_Test *this)

{
  bool bVar1;
  unit_data uVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *in_R9;
  ulong uVar5;
  precise_unit pVar6;
  precise_unit pVar7;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  precise_unit local_190;
  undefined1 local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  precise_unit local_160;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  precise_unit local_30;
  
  local_190 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  _local_1a0 = units::precise_unit::operator/(&local_190,(precise_unit *)units::precise::s);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"meters per second per second","");
  uVar3 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_50,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"precise::m / precise::s / precise::s",
             "unit_from_string(\"meters per second per second\")",(precise_unit *)local_1a0,
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x330,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_190 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::mile,(precise_unit *)units::precise::hr);
  _local_1a0 = units::precise_unit::operator/(&local_190,(precise_unit *)units::precise::s);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"miles per hour per second","");
  uVar3 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_70,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"precise::mile / precise::hr / precise::s",
             "unit_from_string(\"miles per hour per second\")",(precise_unit *)local_1a0,&local_160)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x333,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_190.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::micro + 8),(unit_data *)(units::precise::mol + 8));
  local_190.multiplier_ = (double)&DAT_3eb0c6f7a0b5ed8d;
  local_190.commodity_ = 0;
  local_160.base_units_ = (unit_data)0x3;
  local_160.commodity_ = 0;
  local_160.multiplier_ = 0.0001;
  _local_1a0 = units::precise_unit::operator/(&local_190,&local_160);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"micromole per deciliter","");
  uVar3 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_90,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"precise::micro * precise::mol / (precise_unit(0.1, precise::L))"
             ,"unit_from_string(\"micromole per deciliter\")",(precise_unit *)local_1a0,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x336,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"$ per 24 hrs","");
  uVar3 = units::getDefaultFlags();
  _local_1a0 = units::unit_from_string(&local_b0,uVar3);
  local_160.base_units_ = (unit_data)0x10;
  local_160.commodity_ = 0;
  local_160.multiplier_ = 86400.0;
  local_190 = units::precise_unit::operator/((precise_unit *)units::precise::currency,&local_160);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"unit_from_string(\"$ per 24 hrs\")",
             "precise::currency / precise_unit(24.0, precise::hr)",(precise_unit *)local_1a0,
             &local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x339,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"kilogram / minute(Gasoline at 15.5 C)","");
  uVar3 = units::getDefaultFlags();
  _local_1a0 = units::unit_from_string(&local_d0,uVar3);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"unit_from_string(\"kilogram / minute(Gasoline at 15.5 C)\")",
             "precise::error",(precise_unit *)local_1a0,(precise_unit *)units::precise::error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"g/(8.h){shift}","");
  uVar3 = units::getDefaultFlags();
  _local_1a0 = units::unit_from_string(&local_f0,uVar3);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_180,"unit_from_string(\"g/(8.h){shift}\")","precise::error",
             (precise_unit *)local_1a0,(precise_unit *)units::precise::error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a0 + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::ohm + 8),(unit_data *)(units::precise::meter + 8)
                    );
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"statohm micrometer","");
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_110,uVar3);
  bVar1 = pVar6._8_8_ >> 0x20 == 0 && (((uint)uVar2 ^ (uint)pVar6.base_units_) & 0x307ffff) == 0;
  local_1a0[0] = bVar1;
  local_198._0_4_ = (unit_data)0x0;
  local_198._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == &local_110.field_2) {
    if (bVar1) goto LAB_00181047;
LAB_00180fa3:
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)local_1a0,
               (AssertionResult *)
               "(precise::ohm * precise::meter) .is_convertible(unit_from_string(\"statohm micrometer\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x341,(char *)CONCAT71(local_180._1_7_,local_180[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_180._1_7_,local_180[0]) != &local_170) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_180._1_7_,local_180[0]),local_170._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_190.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_190.multiplier_ + 8))();
    }
  }
  else {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    if (((undefined1  [16])_local_1a0 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_00180fa3;
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1a0 + 8),local_198);
  }
LAB_00181047:
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"coulomb/square meter","");
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_130,uVar3);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pVar6.multiplier_,&local_150,"ampere hour/square meter","");
  uVar3 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_150,uVar3);
  uVar5 = pVar7._8_8_ ^ pVar6._8_8_;
  local_1a0[0] = (uVar5 & 0xffffffff0307ffff) == 0;
  local_198._0_4_ = (unit_data)0x0;
  local_198._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((uVar5 & 0xffffffff0307ffff) != 0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_180,(internal *)local_1a0,
               (AssertionResult *)
               "unit_from_string(\"coulomb/square meter\") .is_convertible(unit_from_string(\"ampere hour/square meter\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x344,(char *)CONCAT71(local_180._1_7_,local_180[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_180._1_7_,local_180[0]) != &local_170) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_180._1_7_,local_180[0]),local_170._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_190.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_190.multiplier_ + 8))();
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a0 + 8),local_198);
    }
  }
  return;
}

Assistant:

TEST(stringToUnits, complex)
{
    EXPECT_EQ(
        precise::m / precise::s / precise::s,
        unit_from_string("meters per second per second"));
    EXPECT_EQ(
        precise::mile / precise::hr / precise::s,
        unit_from_string("miles per hour per second"));
    EXPECT_EQ(
        precise::micro * precise::mol / (precise_unit(0.1, precise::L)),
        unit_from_string("micromole per deciliter"));
    EXPECT_EQ(
        unit_from_string("$ per 24 hrs"),
        precise::currency / precise_unit(24.0, precise::hr));

    EXPECT_NE(
        unit_from_string("kilogram / minute(Gasoline at 15.5 C)"),
        precise::error);
    EXPECT_NE(unit_from_string("g/(8.h){shift}"), precise::error);

    EXPECT_TRUE((precise::ohm * precise::meter)
                    .is_convertible(unit_from_string("statohm micrometer")));
    EXPECT_TRUE(
        unit_from_string("coulomb/square meter")
            .is_convertible(unit_from_string("ampere hour/square meter")));
}